

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_fee.cpp
# Opt level: O2

void __thiscall
FeeCalculator_CalculateFeeTest_Test::TestBody(FeeCalculator_CalculateFeeTest_Test *this)

{
  bool bVar1;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  char *pcVar2;
  AssertHelper local_38;
  AssertHelper local_30;
  AssertionResult gtest_ar;
  undefined8 local_18;
  undefined1 local_10;
  
  cfd::core::Amount::Amount((Amount *)&local_18);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_18 = cfd::FeeCalculator::CalculateFee(3000,1000,11000);
      local_10 = extraout_DL;
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_fee.cpp"
               ,0x14,
               "Expected: (amt = FeeCalculator::CalculateFee(3000, 1000, 11000)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  local_38.data_ = (AssertHelperData *)cfd::core::Amount::GetSatoshiValue();
  local_30.data_ = (AssertHelperData *)0x2af8;
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)&gtest_ar,"amt.GetSatoshiValue()","static_cast<int64_t>(11000)",
             (long *)&local_38,(long *)&local_30);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_38);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_fee.cpp"
               ,0x15,pcVar2);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_38);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_18 = cfd::FeeCalculator::CalculateFee(3000,3000,10000);
      local_10 = extraout_DL_00;
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_fee.cpp"
               ,0x17,
               "Expected: (amt = FeeCalculator::CalculateFee(3000, 3000, 10000)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  local_38.data_ = (AssertHelperData *)cfd::core::Amount::GetSatoshiValue();
  local_30.data_ = (AssertHelperData *)0x7530;
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)&gtest_ar,"amt.GetSatoshiValue()","static_cast<int64_t>(30000)",
             (long *)&local_38,(long *)&local_30);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_38);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_fee.cpp"
               ,0x18,pcVar2);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_38);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(FeeCalculator, CalculateFeeTest)
{
  Amount amt;
  EXPECT_NO_THROW((amt = FeeCalculator::CalculateFee(3000, 1000, 11000)));
  EXPECT_EQ(amt.GetSatoshiValue(), static_cast<int64_t>(11000));

  EXPECT_NO_THROW((amt = FeeCalculator::CalculateFee(3000, 3000, 10000)));
  EXPECT_EQ(amt.GetSatoshiValue(), static_cast<int64_t>(30000));
}